

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O1

void __thiscall
ConfidentialTransaction_PeginWitnessTest_Test::TestBody
          (ConfidentialTransaction_PeginWitnessTest_Test *this)

{
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  undefined8 uVar1;
  bool bVar2;
  uint32_t tx_in_index;
  uint32_t uVar3;
  pointer puVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  pointer in_stack_fffffffffffffc48;
  AssertionResult gtest_ar_6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  AssertionResult gtest_ar_4;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_370;
  ScriptWitness witness;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [19];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1f0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> tx_peg_vector;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_peg_vector;
  ByteData256 witness_only_hash;
  ByteData160 exp_data160;
  ConfidentialTransaction tx;
  ByteData256 exp_data256;
  ByteData exp_data;
  ByteData256 local_100;
  ByteData256 local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  ConfidentialValue local_a0;
  ConfidentialValue local_78;
  ScriptWitness exp_pegin_witness;
  
  GetExpectPeginWitnessStack();
  gtest_ar._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar,"1234567890","");
  cfd::core::ByteData::ByteData(&exp_data,(string *)&gtest_ar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  gtest_ar._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"1234567890123456789012345678901234567890","");
  cfd::core::ByteData160::ByteData160(&exp_data160,(string *)&gtest_ar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  gtest_ar._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"1234567890123456789012345678901234567890123456789012345678901234",
             "");
  cfd::core::ByteData256::ByteData256(&exp_data256,(string *)&gtest_ar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  cfd::core::ScriptWitness::GetWitness(&local_370,&exp_pegin_witness);
  cfd::core::ByteData256::ByteData256(&witness_only_hash);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,&exp_tx_hex_abi_cxx11_);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    tx_in_index = 0;
    if (bVar2) {
      tx_in_index = cfd::core::ConfidentialTransaction::AddTxIn
                              (&tx,&exp_txid,2,0xfffffffe,&exp_script);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&witness,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x135,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&witness,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&witness);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
    tx_in_index = 0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_e8.data_,&exp_blinding_nonce.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_100.data_,&exp_asset_entropy.data_);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_78,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_a0,&exp_inflation_keys);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_b8,&exp_issuance_amount_rangeproof.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_d0,&exp_inflation_keys_rangeproof.data_);
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_d0;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_b8;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc48;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = gtest_ar_6._4_4_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = gtest_ar_6.success_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_3_ = gtest_ar_6._1_3_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar_6.message_.ptr_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_3a0._M_allocated_capacity;
      cfd::core::ConfidentialTransaction::SetIssuance
                (&tx,tx_in_index,&local_e8,&local_100,&local_78,&local_a0,issuance_amount_rangeproof
                 ,inflation_keys_rangeproof);
      if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_a0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007f6a50;
      if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_78._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007f6a50;
      if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_100.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_100.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&witness,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x13a,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&witness,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&witness);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  uVar3 = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum(&tx,tx_in_index);
  witness._vptr_ScriptWitness = (_func_int **)CONCAT44(witness._vptr_ScriptWitness._4_4_,uVar3);
  gtest_ar_6.success_ = false;
  gtest_ar_6._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetPeginWitnessStackNum(index)","0",(uint *)&witness,
             (int *)&gtest_ar_6);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&witness);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x13b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&witness);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (witness._vptr_ScriptWitness != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (witness._vptr_ScriptWitness != (_func_int **)0x0)) {
        (**(code **)(*witness._vptr_ScriptWitness + 8))();
      }
      witness._vptr_ScriptWitness = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash((ByteData256 *)&gtest_ar,&tx);
      cfd::core::ByteData256::operator=(&witness_only_hash,(ByteData256 *)&gtest_ar);
      if (gtest_ar._0_8_ != 0) {
        operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity - gtest_ar._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&witness,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x13e,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&witness,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&witness);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,&witness_only_hash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&witness,"witness_only_hash.GetHex().c_str()",
             "\"5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99\"",
             (char *)gtest_ar._0_8_,
             "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if ((char)witness._vptr_ScriptWitness == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (witness.witness_stack_.
        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      puVar4 = "";
    }
    else {
      puVar4 = ((witness.witness_stack_.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start)->data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x141,(char *)puVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&witness.witness_stack_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007e9920;
  witness.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  witness.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  witness.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                    ((ScriptWitness *)&gtest_ar,&tx,tx_in_index,
                     (ByteData *)
                     ((long)&((local_370.
                               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                               ._M_impl.super__Vector_impl_data._M_start)->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar6));
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                    (&witness.witness_stack_,
                     (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar.message_);
          gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar.message_);
        }
      }
      else {
        testing::Message::Message((Message *)&gtest_ar);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                   ,0x147,
                   "Expected: (witness = tx.AddPeginWitnessStack(index, exp_peg_vector[idx])) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
        if (gtest_ar._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 0;
        }
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar7 < (ulong)(((long)local_370.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_370.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  cfd::core::ScriptWitness::GetWitness(&test_peg_vector,&witness);
  if (local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar,
                 (ByteData *)
                 ((long)&((test_peg_vector.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar6));
      uVar1 = gtest_ar._0_8_;
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar_6,
                 (ByteData *)
                 ((long)&((local_370.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar6));
      testing::internal::CmpHelperSTREQ
                ((internal *)&tx_peg_vector,"test_peg_vector[idx].GetHex().c_str()",
                 "exp_peg_vector[idx].GetHex().c_str()",(char *)uVar1,
                 (char *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != &local_3a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_),
                        (ulong)(local_3a0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != local_328) {
        operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
      }
      if ((char)tx_peg_vector.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_start == '\0') {
        testing::Message::Message((Message *)&gtest_ar);
        puVar4 = "";
        if (tx_peg_vector.
            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          puVar4 = ((tx_peg_vector.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                   ,0x14c,(char *)puVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
        if (gtest_ar._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tx_peg_vector.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_finish,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar7 < (ulong)(((long)local_370.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_370.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  cfd::core::ConfidentialTransaction::GetTxIn
            ((ConfidentialTxInReference *)&gtest_ar,&tx,tx_in_index);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_3_ = 0x7e99;
  gtest_ar_6._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_,&local_1f0);
  cfd::core::ScriptWitness::GetWitness(&tx_peg_vector,(ScriptWitness *)&gtest_ar_6);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_3_ = 0x7e99;
  gtest_ar_6._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&gtest_ar);
  if (tx_peg_vector.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pointer)CONCAT71(tx_peg_vector.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        (char)tx_peg_vector.
                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar,
                 (ByteData *)
                 ((long)&((test_peg_vector.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar6));
      uVar1 = gtest_ar._0_8_;
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar_6,
                 (ByteData *)
                 (CONCAT71(tx_peg_vector.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           (char)tx_peg_vector.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + lVar6));
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_4,"test_peg_vector[idx].GetHex().c_str()",
                 "tx_peg_vector[idx].GetHex().c_str()",(char *)uVar1,
                 (char *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != &local_3a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_),
                        (ulong)(local_3a0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != local_328) {
        operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
      }
      if (gtest_ar_4.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar5 = "";
        if (gtest_ar_4.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                   ,0x152,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
        if (gtest_ar._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_4.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar7 < (ulong)(((long)tx_peg_vector.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              CONCAT71(tx_peg_vector.
                                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       (char)tx_peg_vector.
                                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            -0x5555555555555555));
  }
  gtest_ar_4._0_4_ = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum(&tx,tx_in_index);
  gtest_ar_6._0_8_ =
       ((long)local_370.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_370.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"tx.GetPeginWitnessStackNum(index)","exp_peg_vector.size()",
             (uint *)&gtest_ar_4,(unsigned_long *)&gtest_ar_6);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x154,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar_6._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_6._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
      }
      gtest_ar_6.success_ = false;
      gtest_ar_6._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash((ByteData256 *)&gtest_ar,&tx);
      cfd::core::ByteData256::operator=(&witness_only_hash,(ByteData256 *)&gtest_ar);
      if (gtest_ar._0_8_ != 0) {
        operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity - gtest_ar._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x157,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,&witness_only_hash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_6,"witness_only_hash.GetHex().c_str()",
             "\"7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a\"",
             (char *)gtest_ar._0_8_,
             "7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_6.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::AddPeginWitnessStack
              ((ScriptWitness *)&gtest_ar,&tx,tx_in_index + 5,&exp_data160);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&witness.witness_stack_,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
    gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x15e,
             "Expected: (witness = tx.AddPeginWitnessStack(index + 5, exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
  if (gtest_ar._0_8_ != 0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                ((ScriptWitness *)&gtest_ar,&tx,tx_in_index,&exp_data160);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15f,
               "Expected: (witness = tx.AddPeginWitnessStack(index, exp_data160)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                ((ScriptWitness *)&gtest_ar,&tx,tx_in_index,&exp_data256);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x160,
               "Expected: (witness = tx.AddPeginWitnessStack(index, exp_data256)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar,&witness
            );
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&test_peg_vector,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar);
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)&gtest_ar,
             (ByteData *)
             (((long)local_370.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)local_370.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_start) +
             (long)test_peg_vector.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&gtest_ar_6,&exp_data160);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[exp_peg_vector.size()].GetHex().c_str()",
             "exp_data160.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_6._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_,(ulong)(local_3a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x163,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)&gtest_ar,
             (ByteData *)
             ((long)test_peg_vector.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_start +
             (long)local_370.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
             (0x18 - (long)local_370.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start)));
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_6,&exp_data256);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str()",
             "exp_data256.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_6._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_,(ulong)(local_3a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x165,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_4._0_4_ = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum(&tx,tx_in_index);
  gtest_ar_6._0_8_ =
       ((long)local_370.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_370.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"tx.GetPeginWitnessStackNum(index)","exp_peg_vector.size() + 2",
             (uint *)&gtest_ar_4,(unsigned_long *)&gtest_ar_6);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x166,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar_6._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar_6._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
      }
      gtest_ar_6.success_ = false;
      gtest_ar_6._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash((ByteData256 *)&gtest_ar,&tx);
      cfd::core::ByteData256::operator=(&witness_only_hash,(ByteData256 *)&gtest_ar);
      if (gtest_ar._0_8_ != 0) {
        operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity - gtest_ar._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x169,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,&witness_only_hash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_6,"witness_only_hash.GetHex().c_str()",
             "\"ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf\"",
             (char *)gtest_ar._0_8_,
             "ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x16c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_6.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetPeginWitnessStack
              ((ScriptWitness *)&gtest_ar,&tx,tx_in_index + 5,
               (int)((ulong)((long)local_370.
                                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_370.
                                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,
               &exp_data160);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&witness.witness_stack_,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
    gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x172,
             "Expected: (witness = tx.SetPeginWitnessStack(index + 5, static_cast<size_t>(exp_peg_vector.size()), exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
  if (gtest_ar._0_8_ != 0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::SetPeginWitnessStack
              ((ScriptWitness *)&gtest_ar,&tx,tx_in_index,
               (int)((ulong)((long)local_370.
                                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_370.
                                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + 5
               ,&exp_data160);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&witness.witness_stack_,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
    gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x176,
             "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 5, exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
  if (gtest_ar._0_8_ != 0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((ScriptWitness *)&gtest_ar,&tx,tx_in_index,0,&exp_data);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x177,
               "Expected: (witness = tx.SetPeginWitnessStack(index, 0, exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((ScriptWitness *)&gtest_ar,&tx,tx_in_index,
                 (int)((ulong)((long)local_370.
                                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_370.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,
                 &exp_data256);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x17a,
               "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()), exp_data256)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((ScriptWitness *)&gtest_ar,&tx,tx_in_index,
                 (int)((ulong)((long)local_370.
                                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_370.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 +
                 1,&exp_data160);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar._0_8_ = &PTR__ScriptWitness_007e9920;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x17d,
               "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 1, exp_data160)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar,&witness
            );
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&test_peg_vector,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar);
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)&gtest_ar,
             test_peg_vector.
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
             super__Vector_impl_data._M_start);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_6,&exp_data);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[0].GetHex().c_str()",
             "exp_data.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_6._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_,(ulong)(local_3a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x17f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)&gtest_ar,
             (ByteData *)
             (((long)local_370.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)local_370.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_start) +
             (long)test_peg_vector.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_start));
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar_6,&exp_data256);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[exp_peg_vector.size()].GetHex().c_str()",
             "exp_data256.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_6._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_,(ulong)(local_3a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x181,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_
            ((string *)&gtest_ar,
             (ByteData *)
             ((long)test_peg_vector.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_start +
             (long)local_370.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
             (0x18 - (long)local_370.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start)));
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData160::GetHex_abi_cxx11_((string *)&gtest_ar_6,&exp_data160);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str()",
             "exp_data160.GetHex().c_str()",(char *)uVar1,(char *)gtest_ar_6._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_,(ulong)(local_3a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x183,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTransaction::GetTxIn
            ((ConfidentialTxInReference *)&gtest_ar,&tx,tx_in_index);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_3_ = 0x7e99;
  gtest_ar_6._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_,&local_1f0);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_4,
             (ScriptWitness *)&gtest_ar_6);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&tx_peg_vector,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_4);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_4);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_3_ = 0x7e99;
  gtest_ar_6._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&gtest_ar);
  if (tx_peg_vector.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pointer)CONCAT71(tx_peg_vector.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        (char)tx_peg_vector.
                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar,
                 (ByteData *)
                 ((long)&((test_peg_vector.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar6));
      uVar1 = gtest_ar._0_8_;
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar_6,
                 (ByteData *)
                 (CONCAT71(tx_peg_vector.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           (char)tx_peg_vector.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + lVar6));
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_4,"test_peg_vector[idx].GetHex().c_str()",
                 "tx_peg_vector[idx].GetHex().c_str()",(char *)uVar1,
                 (char *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != &local_3a0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_),
                        (ulong)(local_3a0._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != local_328) {
        operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
      }
      if (gtest_ar_4.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar5 = "";
        if (gtest_ar_4.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                   ,0x187,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
        if (gtest_ar._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_4.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar7 < (ulong)(((long)tx_peg_vector.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              CONCAT71(tx_peg_vector.
                                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       (char)tx_peg_vector.
                                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            -0x5555555555555555));
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash((ByteData256 *)&gtest_ar,&tx);
      cfd::core::ByteData256::operator=(&witness_only_hash,(ByteData256 *)&gtest_ar);
      if (gtest_ar._0_8_ != 0) {
        operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity - gtest_ar._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x18b,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,&witness_only_hash);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_6,"witness_only_hash.GetHex().c_str()",
             "\"28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa\"",
             (char *)gtest_ar._0_8_,
             "28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar._0_8_ != local_328) {
    operator_delete((void *)gtest_ar._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x18e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_6.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll(&tx,tx_in_index + 5);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x191,
             "Expected: (tx.RemovePeginWitnessStackAll(index + 5)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
  if (gtest_ar._0_8_ != 0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll(&tx,tx_in_index);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x192,
               "Expected: (tx.RemovePeginWitnessStackAll(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  gtest_ar_6._0_4_ = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum(&tx,tx_in_index);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetPeginWitnessStackNum(index)","0",(uint *)&gtest_ar_6,
             (int *)&gtest_ar_4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x193,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) + 8))();
      }
      gtest_ar_6.success_ = false;
      gtest_ar_6._1_3_ = 0;
      gtest_ar_6._4_4_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&tx_peg_vector);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&test_peg_vector);
  witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007e9920;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&witness.witness_stack_);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  if (witness_only_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(witness_only_hash.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)witness_only_hash.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)witness_only_hash.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_370);
  if (exp_data256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data256.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)exp_data256.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)exp_data256.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (exp_data160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data160.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)exp_data160.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)exp_data160.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)exp_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)exp_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  exp_pegin_witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_007e9920;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_pegin_witness.witness_stack_);
  return;
}

Assistant:

TEST(ConfidentialTransaction, PeginWitnessTest) {
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  const ByteData160 exp_data160("1234567890123456789012345678901234567890");
  const ByteData256 exp_data256(
      "1234567890123456789012345678901234567890123456789012345678901234");
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  ByteData256 witness_only_hash = ByteData256();

  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));
  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), 0);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");

  // AddPeginWitness
  ScriptWitness witness;
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_NO_THROW(
        (witness = tx.AddPeginWitnessStack(index, exp_peg_vector[idx])));
  }
  std::vector<ByteData> test_peg_vector = witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 exp_peg_vector[idx].GetHex().c_str());
  }
  std::vector<ByteData> tx_peg_vector = tx.GetTxIn(index).GetPeginWitness()
      .GetWitness();
  for (size_t idx = 0; idx < tx_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 tx_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), exp_peg_vector.size());

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a");

  // AddPeginWitness(160,256)
  EXPECT_THROW((witness = tx.AddPeginWitnessStack(index + 5, exp_data160)),
               CfdException);
  EXPECT_NO_THROW((witness = tx.AddPeginWitnessStack(index, exp_data160)));
  EXPECT_NO_THROW((witness = tx.AddPeginWitnessStack(index, exp_data256)));
  test_peg_vector = witness.GetWitness();
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size()].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), exp_peg_vector.size() + 2);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf");

  // SetPeginWitnessStack
  EXPECT_THROW(
      (witness = tx.SetPeginWitnessStack(index + 5, static_cast<size_t>(exp_peg_vector.size()),
                                         exp_data160)),
      CfdException);
  EXPECT_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 5,
                                         exp_data160)),
      CfdException);
  EXPECT_NO_THROW((witness = tx.SetPeginWitnessStack(index, 0, exp_data)));
  EXPECT_NO_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()),
                                         exp_data256)));
  EXPECT_NO_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 1,
                                         exp_data160)));
  test_peg_vector = witness.GetWitness();
  EXPECT_STREQ(test_peg_vector[0].GetHex().c_str(), exp_data.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size()].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  tx_peg_vector = tx.GetTxIn(index).GetPeginWitness().GetWitness();
  for (size_t idx = 0; idx < tx_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 tx_peg_vector[idx].GetHex().c_str());
  }

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa");

  // RemovePeginWitnessStackAll
  EXPECT_THROW((tx.RemovePeginWitnessStackAll(index + 5)), CfdException);
  EXPECT_NO_THROW((tx.RemovePeginWitnessStackAll(index)));
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), 0);
}